

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gens_opn2.cpp
# Opt level: O1

void __thiscall GensOPN2::writeReg(GensOPN2 *this,uint32_t port,uint16_t addr,uint8_t data)

{
  Ym2612 *this_00;
  undefined3 in_register_00000009;
  undefined4 uVar1;
  undefined4 in_register_0000000c;
  int __fd;
  int __fd_00;
  
  uVar1 = CONCAT31(in_register_00000009,data);
  this_00 = this->chip;
  if (port == 0) {
    __fd = 1;
    __fd_00 = 0;
  }
  else {
    if (port != 1) {
      return;
    }
    __fd = 3;
    __fd_00 = 2;
  }
  LibGens::Ym2612::write
            (this_00,__fd_00,(void *)(ulong)(byte)addr,CONCAT44(in_register_0000000c,uVar1));
  LibGens::Ym2612::write(this_00,__fd,(void *)(ulong)data,CONCAT44(in_register_0000000c,uVar1));
  return;
}

Assistant:

void GensOPN2::writeReg(uint32_t port, uint16_t addr, uint8_t data)
{
     LibGens::Ym2612 *chip = this->chip;

    switch (port)
    {
    case 0:
        chip->write(0, addr);
        chip->write(1, data);
        break;
    case 1:
        chip->write(2, addr);
        chip->write(3, data);
        break;
    }
}